

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

int l_strcmp(TString *ls,TString *rs)

{
  int iVar1;
  char *pcVar2;
  size_t len;
  char *pcStack_40;
  int temp;
  size_t lr;
  char *r;
  size_t ll;
  char *l;
  TString *rs_local;
  TString *ls_local;
  
  ll = (size_t)(ls + 1);
  r = (char *)(ls->tsv).len;
  lr = (size_t)(rs + 1);
  pcStack_40 = (char *)(rs->tsv).len;
  while( true ) {
    iVar1 = strcoll((char *)ll,(char *)lr);
    if (iVar1 != 0) {
      return iVar1;
    }
    pcVar2 = (char *)strlen((char *)ll);
    if (pcVar2 == pcStack_40) break;
    if (pcVar2 == r) {
      return -1;
    }
    pcVar2 = pcVar2 + 1;
    ll = (size_t)(pcVar2 + ll);
    r = r + -(long)pcVar2;
    lr = (size_t)(pcVar2 + lr);
    pcStack_40 = pcStack_40 + -(long)pcVar2;
  }
  return (uint)(pcVar2 != r);
}

Assistant:

static int l_strcmp (const TString *ls, const TString *rs) {
  const char *l = getstr(ls);
  size_t ll = ls->tsv.len;
  const char *r = getstr(rs);
  size_t lr = rs->tsv.len;
  for (;;) {
    int temp = strcoll(l, r);
    if (temp != 0) return temp;
    else {  /* strings are equal up to a `\0' */
      size_t len = strlen(l);  /* index of first `\0' in both strings */
      if (len == lr)  /* r is finished? */
        return (len == ll) ? 0 : 1;
      else if (len == ll)  /* l is finished? */
        return -1;  /* l is smaller than r (because r is not finished) */
      /* both strings longer than `len'; go on comparing (after the `\0') */
      len++;
      l += len; ll -= len; r += len; lr -= len;
    }
  }
}